

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O2

uint ** gf_matr_mul(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  uint *puVar1;
  uint uVar2;
  uint **ppuVar3;
  uint uVar4;
  ulong uVar5;
  uint _k;
  ulong uVar6;
  uint j;
  ulong uVar7;
  
  if (a_cols == b_rows) {
    ppuVar3 = matrix_new(a_rows,b_cols);
    for (uVar5 = 0; uVar5 != a_rows; uVar5 = uVar5 + 1) {
      for (uVar7 = 0; uVar7 != b_cols; uVar7 = uVar7 + 1) {
        puVar1 = ppuVar3[uVar5];
        puVar1[uVar7] = 0;
        uVar4 = 0;
        for (uVar6 = 0; a_cols != uVar6; uVar6 = uVar6 + 1) {
          uVar2 = gf_mul(a[uVar5][uVar6],b[uVar6][uVar7]);
          uVar4 = uVar4 ^ uVar2;
          puVar1[uVar7] = uVar4;
        }
      }
    }
    return ppuVar3;
  }
  fatal((uchar *)"gf_matr_mul",(uchar *)" a_cols != b_rows\n");
}

Assistant:

uint32_t **gf_matr_mul(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
                  uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_cols != b_rows)
        fatal("gf_matr_mul", " a_cols != b_rows\n");

    uint32_t **c = matrix_new(a_rows, b_cols);
    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < b_cols; j++)
        {
            c[i][j] = 0;
            for (uint32_t _k = 0; _k < b_rows; _k++)
                c[i][j] = gf_sum(c[i][j], gf_mul(a[i][_k], b[_k][j]));
        }

    return c;
}